

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptor::DebugString
          (EnumValueDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  int iVar2;
  string *options;
  EnumValueOptions *output;
  EnumDescriptor *this_00;
  SourceLocationCommentPrinter *this_01;
  DescriptorPool *output_00;
  char *in_RDX;
  int in_ESI;
  EnumValueDescriptor *in_RDI;
  string formatted_options;
  SourceLocationCommentPrinter comment_printer;
  string prefix;
  string *in_stack_fffffffffffffa98;
  int value_00;
  string *value;
  SubstituteArg *in_stack_fffffffffffffaa0;
  SourceLocationCommentPrinter *this_02;
  DebugStringOptions *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  EnumValueDescriptor *in_stack_fffffffffffffad8;
  SourceLocationCommentPrinter *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb08;
  SourceLocationCommentPrinter *in_stack_fffffffffffffb10;
  char *pcVar3;
  int depth_00;
  SubstituteArg local_4d0;
  SubstituteArg local_4a0;
  SubstituteArg local_470;
  SubstituteArg local_440;
  undefined1 local_410 [96];
  SubstituteArg local_3b0;
  SubstituteArg local_380;
  SubstituteArg local_350 [2];
  string local_2f0 [8];
  SubstituteArg *in_stack_fffffffffffffd18;
  SubstituteArg *in_stack_fffffffffffffd20;
  SubstituteArg *in_stack_fffffffffffffd28;
  SubstituteArg *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  string *in_stack_fffffffffffffd40;
  SubstituteArg *in_stack_fffffffffffffd50;
  SubstituteArg *in_stack_fffffffffffffd58;
  SubstituteArg *in_stack_fffffffffffffd60;
  SubstituteArg *in_stack_fffffffffffffd68;
  SubstituteArg *in_stack_fffffffffffffd70;
  SubstituteArg *in_stack_fffffffffffffd78;
  SubstituteArg local_270;
  SubstituteArg local_240;
  undefined1 local_210 [96];
  SubstituteArg local_1b0 [7];
  allocator local_41;
  string local_40 [40];
  char *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(long)(in_ESI * 2),' ',&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::EnumValueDescriptor>
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             (string *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
             in_stack_fffffffffffffac8);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  pcVar3 = local_18;
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  depth_00 = (int)((ulong)pcVar3 >> 0x20);
  options = name_abi_cxx11_(in_RDI);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  value_00 = (int)((ulong)in_stack_fffffffffffffa98 >> 0x20);
  iVar2 = number(in_RDI);
  strings::internal::SubstituteArg::SubstituteArg(in_stack_fffffffffffffaa0,value_00);
  strings::internal::SubstituteArg::SubstituteArg(local_1b0);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_210 + 0x30));
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_210);
  strings::internal::SubstituteArg::SubstituteArg(&local_240);
  strings::internal::SubstituteArg::SubstituteArg(&local_270);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffd60);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffd30);
  this_02 = (SourceLocationCommentPrinter *)local_210;
  value = (string *)(local_210 + 0x30);
  strings::SubstituteAndAppend
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,in_stack_fffffffffffffd78);
  std::__cxx11::string::string(local_2f0);
  output = EnumValueDescriptor::options(in_RDI);
  this_00 = type(in_RDI);
  this_01 = (SourceLocationCommentPrinter *)EnumDescriptor::file(this_00);
  output_00 = FileDescriptor::pool((FileDescriptor *)this_01);
  bVar1 = anon_unknown_1::FormatBracketedOptions
                    (depth_00,(Message *)options,
                     (DescriptorPool *)CONCAT44(iVar2,in_stack_fffffffffffffb00),(string *)output);
  if (bVar1) {
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_02,value);
    strings::internal::SubstituteArg::SubstituteArg(local_350);
    strings::internal::SubstituteArg::SubstituteArg(&local_380);
    strings::internal::SubstituteArg::SubstituteArg(&local_3b0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_410 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_410);
    strings::internal::SubstituteArg::SubstituteArg(&local_440);
    strings::internal::SubstituteArg::SubstituteArg(&local_470);
    strings::internal::SubstituteArg::SubstituteArg(&local_4a0);
    strings::internal::SubstituteArg::SubstituteArg(&local_4d0);
    this_02 = (SourceLocationCommentPrinter *)local_410;
    strings::SubstituteAndAppend
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,in_stack_fffffffffffffd78);
  }
  std::__cxx11::string::append(local_18);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(this_01,(string *)output_00);
  std::__cxx11::string::~string(local_2f0);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(this_02);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void EnumValueDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0$1 = $2", prefix, name(), number());

  std::string formatted_options;
  if (FormatBracketedOptions(depth, options(), type()->file()->pool(),
                             &formatted_options)) {
    strings::SubstituteAndAppend(contents, " [$0]", formatted_options);
  }
  contents->append(";\n");

  comment_printer.AddPostComment(contents);
}